

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pTVar1;
  cmGeneratorTarget *this_01;
  pointer pDVar2;
  bool bVar3;
  string *psVar4;
  cmLocalUnixMakefileGenerator3 *this_02;
  Dir *d;
  pointer pDVar5;
  pointer pTVar6;
  bool bVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string tname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  size_t local_d8;
  char *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  string local_a8;
  cmLocalUnixMakefileGenerator3 *local_88;
  cmGlobalUnixMakefileGenerator3 *local_80;
  DirectoryTarget *local_78;
  string local_70;
  string makeTarget;
  
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  local_88 = rootLG;
  local_80 = this;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  local_f0.first._M_str = (psVar4->_M_dataplus)._M_p;
  local_f0.first._M_len = psVar4->_M_string_length;
  local_f0.second = (string *)0x0;
  doc.field_2._M_allocated_capacity = (long)&doc.field_2 + 8;
  doc._M_dataplus._M_p = (pointer)0x0;
  doc._M_string_length = 1;
  doc.field_2._M_local_buf[8] = '/';
  local_d8 = 1;
  local_c8 = 0;
  local_d0 = (char *)doc.field_2._M_allocated_capacity;
  local_c0 = strlen(pass);
  local_b0 = 0;
  views._M_len = 3;
  views._M_array = &local_f0;
  local_b8 = pass;
  cmCatViews(&makeTarget,views);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar6 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = dt;
  if (pTVar6 != pTVar1) {
    do {
      if (check_all) {
        bVar7 = (pTVar6->ExcludedFromAllInConfigs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pTVar6->ExcludedFromAllInConfigs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (check_relink && bVar7) goto LAB_005c5129;
LAB_005c5152:
        bVar3 = false;
      }
      else {
        if (!check_relink) {
          bVar7 = true;
          goto LAB_005c5152;
        }
LAB_005c5129:
        this_01 = pTVar6->GT;
        cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_(&local_70,this_00);
        bVar7 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,&local_70);
        bVar3 = true;
      }
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar7 != false) {
        this_02 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(pTVar6->GT);
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_a8,this_02,pTVar6->GT);
        local_f0.first._M_len = local_a8._M_string_length;
        local_f0.first._M_str = local_a8._M_dataplus._M_p;
        doc._M_dataplus._M_p = (pointer)0x0;
        doc._M_string_length = 1;
        doc.field_2._M_allocated_capacity = (long)&doc.field_2 + 8;
        doc.field_2._M_local_buf[8] = '/';
        local_d8 = 1;
        local_c8 = 0;
        local_f0.second = &local_a8;
        local_d0 = (char *)doc.field_2._M_allocated_capacity;
        local_c0 = strlen(pass);
        local_b0 = 0;
        views_00._M_len = 3;
        views_00._M_array = &local_f0;
        local_b8 = pass;
        cmCatViews(&tname,views_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &tname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tname._M_dataplus._M_p != &tname.field_2) {
          operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != pTVar1);
  }
  pDVar5 = (local_78->Children).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (local_78->Children).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar5 != pDVar2) {
    do {
      if ((!check_all) || (pDVar5->ExcludeFromAll == false)) {
        local_f0.first._M_str = (pDVar5->Path)._M_dataplus._M_p;
        local_f0.first._M_len = (pDVar5->Path)._M_string_length;
        local_f0.second = (string *)0x0;
        doc._M_dataplus._M_p = (pointer)0x0;
        doc._M_string_length = 1;
        doc.field_2._M_allocated_capacity = (long)&doc.field_2 + 8;
        doc.field_2._M_local_buf[8] = '/';
        local_d8 = 1;
        local_c8 = 0;
        local_d0 = (char *)doc.field_2._M_allocated_capacity;
        local_c0 = strlen(pass);
        local_b0 = 0;
        views_01._M_len = 3;
        views_01._M_array = &local_f0;
        local_b8 = pass;
        cmCatViews(&tname,views_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &tname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tname._M_dataplus._M_p != &tname.field_2) {
          operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
        }
      }
      pDVar5 = pDVar5 + 1;
    } while (pDVar5 != pDVar2);
  }
  if ((depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_80->EmptyRuleHackDepends)._M_string_length != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&local_80->EmptyRuleHackDepends);
  }
  doc._M_string_length = 0;
  doc.field_2._M_allocated_capacity = doc.field_2._M_allocated_capacity & 0xffffffffffffff00;
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  bVar7 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
  if (bVar7) {
    local_f0.first._M_len = 0x14;
    local_f0.first._M_str = "The main recursive \"";
    local_f0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d8 = strlen(pass);
    local_c8 = 0;
    local_c0 = 9;
    local_b8 = "\" target.";
    local_b0 = 0;
    views_02._M_len = 3;
    views_02._M_array = &local_f0;
    local_d0 = pass;
    cmCatViews(&tname,views_02);
  }
  else {
    local_f0.first._M_len = 0xb;
    local_f0.first._M_str = "Recursive \"";
    local_f0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d8 = strlen(pass);
    local_c8 = 0;
    local_c0 = 0x13;
    local_b8 = "\" directory target.";
    local_b0 = 0;
    views_03._M_len = 3;
    views_03._M_array = &local_f0;
    local_d0 = pass;
    cmCatViews(&tname,views_03);
  }
  std::__cxx11::string::operator=((string *)&doc,(string *)&tname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tname._M_dataplus._M_p != &tname.field_2) {
    operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
  }
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (local_88,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)doc._M_dataplus._M_p != &doc.field_2) {
    operator_delete(doc._M_dataplus._M_p,doc.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTarget._M_dataplus._M_p != &makeTarget.field_2) {
    operator_delete(makeTarget._M_dataplus._M_p,makeTarget.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}